

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O0

void Abc_CexPrint(Abc_Cex_t *p)

{
  uint uVar1;
  int local_1c;
  uint local_18;
  int k;
  int f;
  int i;
  Abc_Cex_t *p_local;
  
  if (p == (Abc_Cex_t *)0x0) {
    printf("The counter example is NULL.\n");
  }
  else if (p == (Abc_Cex_t *)0x1) {
    printf("The counter example is present but not available (pointer has value \"1\").\n");
  }
  else {
    Abc_CexPrintStats(p);
    printf("State    : ");
    for (local_1c = 0; local_1c < p->nRegs; local_1c = local_1c + 1) {
      uVar1 = Abc_InfoHasBit((uint *)(p + 1),local_1c);
      printf("%d",(ulong)uVar1);
    }
    printf("\n");
    for (local_18 = 0; (int)local_18 <= p->iFrame; local_18 = local_18 + 1) {
      printf("Frame %3d : ",(ulong)local_18);
      for (k = 0; k < p->nPis; k = k + 1) {
        uVar1 = Abc_InfoHasBit((uint *)(p + 1),local_1c);
        printf("%d",(ulong)uVar1);
        local_1c = local_1c + 1;
      }
      printf("\n");
    }
    if (local_1c != p->nBits) {
      __assert_fail("k == p->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilCex.c"
                    ,0x15b,"void Abc_CexPrint(Abc_Cex_t *)");
    }
  }
  return;
}

Assistant:

void Abc_CexPrint( Abc_Cex_t * p )
{
    int i, f, k;
    if ( p == NULL )
    {
        printf( "The counter example is NULL.\n" );
        return;
    }
    if ( p == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
    {
        printf( "The counter example is present but not available (pointer has value \"1\").\n" );
        return;
    }
    Abc_CexPrintStats( p );
    printf( "State    : " );
    for ( k = 0; k < p->nRegs; k++ )
        printf( "%d", Abc_InfoHasBit(p->pData, k) );
    printf( "\n" );
    for ( f = 0; f <= p->iFrame; f++ )
    {
        printf( "Frame %3d : ", f );
        for ( i = 0; i < p->nPis; i++ )
            printf( "%d", Abc_InfoHasBit(p->pData, k++) );
        printf( "\n" );
    }
    assert( k == p->nBits );
}